

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O2

char * __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::Struct_FieldsEntry_DoNotUse,_google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
::
Parser<google::protobuf::internal::MapFieldLite<google::protobuf::Struct_FieldsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>_>
::_InternalParse(Parser<google::protobuf::internal::MapFieldLite<google::protobuf::Struct_FieldsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>_>
                 *this,char *ptr,ParseContext *ctx)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  size_type sVar1;
  bool bVar2;
  Value *pVVar3;
  KeyMapEntryAccessorType *this_00;
  ValueMapEntryAccessorType *this_01;
  char *local_30;
  char *ptr_local;
  
  local_30 = ptr;
  bVar2 = ParseContext::Done(ctx,&local_30);
  if (bVar2) {
    if (local_30 == (char *)0x0) {
      return (char *)0x0;
    }
  }
  else if (*local_30 == '\n') {
    value = &this->key_;
    local_30 = MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)9,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::Read(local_30 + 1,ctx,value);
    if (local_30 == (char *)0x0) {
      return (char *)0x0;
    }
    bVar2 = Struct_FieldsEntry_DoNotUse::ValidateKey(value);
    if (!bVar2) {
      return (char *)0x0;
    }
    bVar2 = ParseContext::Done(ctx,&local_30);
    if (bVar2) {
      if (local_30 == (char *)0x0) {
        return (char *)0x0;
      }
LAB_0030ec3b:
      NewEntry(this);
    }
    else {
      if (*local_30 != '\x12') goto LAB_0030ec3b;
      sVar1 = this->map_->elements_->num_elements_;
      pVVar3 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
               ::operator[](this->map_,value);
      this->value_ptr_ = pVVar3;
      if (sVar1 == this->map_->elements_->num_elements_) goto LAB_0030ec3b;
      local_30 = ParseContext::ParseMessage<google::protobuf::Value>(ctx,pVVar3,local_30 + 1);
      if (local_30 == (char *)0x0) {
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
        ::erase(this->map_,value);
        return (char *)0x0;
      }
      bVar2 = ParseContext::Done(ctx,&local_30);
      if (bVar2) {
        return local_30;
      }
      if (local_30 == (char *)0x0) {
        return (char *)0x0;
      }
      NewEntry(this);
      pVVar3 = this->value_ptr_;
      this_01 = mutable_value(this->entry_);
      Value::Swap(this_01,pVVar3);
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
      ::erase(this->map_,value);
    }
    this_00 = mutable_key(this->entry_);
    std::__cxx11::string::operator=((string *)this_00,(string *)value);
    goto LAB_0030ec57;
  }
  NewEntry(this);
LAB_0030ec57:
  local_30 = MapEntryImpl<google::protobuf::Struct_FieldsEntry_DoNotUse,_google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
             ::_InternalParse(this->entry_,local_30,ctx);
  if (local_30 == (char *)0x0) {
    return (char *)0x0;
  }
  UseKeyAndValueFromEntry(this);
  return local_30;
}

Assistant:

const char* _InternalParse(const char* ptr, ParseContext* ctx) {
      if (PROTOBUF_PREDICT_TRUE(!ctx->Done(&ptr) && *ptr == kKeyTag)) {
        ptr = KeyTypeHandler::Read(ptr + 1, ctx, &key_);
        if (PROTOBUF_PREDICT_FALSE(!ptr || !Derived::ValidateKey(&key_))) {
          return nullptr;
        }
        if (PROTOBUF_PREDICT_TRUE(!ctx->Done(&ptr) && *ptr == kValueTag)) {
          typename Map::size_type map_size = map_->size();
          value_ptr_ = &(*map_)[key_];
          if (PROTOBUF_PREDICT_TRUE(map_size != map_->size())) {
            using T =
                typename MapIf<ValueTypeHandler::kIsEnum, int*, Value*>::type;
            ptr = ValueTypeHandler::Read(ptr + 1, ctx,
                                         reinterpret_cast<T>(value_ptr_));
            if (PROTOBUF_PREDICT_FALSE(!ptr ||
                                       !Derived::ValidateValue(value_ptr_))) {
              map_->erase(key_);  // Failure! Undo insertion.
              return nullptr;
            }
            if (PROTOBUF_PREDICT_TRUE(ctx->Done(&ptr))) return ptr;
            if (!ptr) return nullptr;
            NewEntry();
            ValueMover::Move(value_ptr_, entry_->mutable_value());
            map_->erase(key_);
            goto move_key;
          }
        } else {
          if (!ptr) return nullptr;
        }
        NewEntry();
      move_key:
        KeyMover::Move(&key_, entry_->mutable_key());
      } else {
        if (!ptr) return nullptr;
        NewEntry();
      }
      ptr = entry_->_InternalParse(ptr, ctx);
      if (ptr) UseKeyAndValueFromEntry();
      return ptr;
    }